

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_float64_primitive_sqrt
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  sysbvm_object_tuple_t *floatObject;
  sysbvm_object_tuple_t *psVar2;
  double __x;
  anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 aVar3;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  uVar1 = *arguments;
  __x = 0.0;
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    __x = *(double *)(uVar1 + 0x10);
  }
  if (__x < 0.0) {
    aVar3 = (anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1)sqrt(__x);
  }
  else {
    aVar3 = (anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1)SQRT(__x);
  }
  psVar2 = sysbvm_context_allocateByteTuple(context,(context->roots).float64Type,8);
  psVar2->field_1 = aVar3;
  return (sysbvm_tuple_t)psVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_float64_primitive_sqrt(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    sysbvm_float64_t operand = sysbvm_tuple_float64_decode(arguments[0]);
    return sysbvm_tuple_float64_encode(context, sqrt(operand));
}